

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O1

bool __thiscall fasttext::Dictionary::readWord(Dictionary *this,istream *in,string *word)

{
  long *plVar1;
  byte *pbVar2;
  uint uVar3;
  
  plVar1 = *(long **)(in + *(long *)(*(long *)in + -0x18) + 0xe8);
  word->_M_string_length = 0;
  *(word->_M_dataplus)._M_p = '\0';
  while( true ) {
    while( true ) {
      pbVar2 = (byte *)plVar1[2];
      if (pbVar2 < (byte *)plVar1[3]) {
        uVar3 = (uint)*pbVar2;
        plVar1[2] = (long)(pbVar2 + 1);
      }
      else {
        uVar3 = (**(code **)(*plVar1 + 0x50))(plVar1);
      }
      if (uVar3 == 0xffffffff) {
        std::istream::get();
        return word->_M_string_length != 0;
      }
      if ((uVar3 < 0x21) && ((0x100003e01U >> ((ulong)uVar3 & 0x3f) & 1) != 0)) break;
      std::__cxx11::string::push_back((char)word);
    }
    if (word->_M_string_length != 0) break;
    if (uVar3 == 10) {
      std::__cxx11::string::_M_append((char *)word,EOS_abi_cxx11_);
      return true;
    }
  }
  if (uVar3 != 10) {
    return true;
  }
  if ((ulong)plVar1[1] < (ulong)plVar1[2]) {
    plVar1[2] = plVar1[2] - 1;
    return true;
  }
  readWord();
  return true;
}

Assistant:

bool Dictionary::readWord(std::istream& in, std::string& word) const
{
  int c;
  std::streambuf& sb = *in.rdbuf();
  word.clear();
  while ((c = sb.sbumpc()) != EOF) {
    if (c == ' ' || c == '\n' || c == '\r' || c == '\t' || c == '\v' ||
        c == '\f' || c == '\0') {
      if (word.empty()) {
        if (c == '\n') {
          word += EOS;
          return true;
        }
        continue;
      } else {
        if (c == '\n')
          sb.sungetc();
        return true;
      }
    }
    word.push_back(c);
  }
  // trigger eofbit
  in.get();
  return !word.empty();
}